

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varispeed_test.c
# Opt level: O2

void varispeed_test(int converter,double target_snr)

{
  uint uVar1;
  SRC_STATE *state;
  ulong uVar2;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  double dVar5;
  undefined8 uStack_80;
  int error;
  SRC_DATA src_data;
  double sine_freq;
  
  memset(varispeed_test::input,0,0x10000);
  sine_freq = 0.0111;
  gen_windowed_sines(1,&sine_freq,1.0,varispeed_test::input,0x2000);
  state = src_new(converter,1,&error);
  if (state == (SRC_STATE *)0x0) {
    pcVar4 = src_strerror(error);
    __format = "\n\nLine %d : src_new () failed : %s\n\n";
    uStack_80 = 0x62;
  }
  else {
    src_data.end_of_input = 1;
    src_data.data_in = varispeed_test::input;
    src_data.input_frames = 0x2000;
    src_data.src_ratio = 3.0;
    src_data.data_out = varispeed_test::output;
    src_data.output_frames = 0x4000;
    error = src_set_ratio(state,0.3333333333333333);
    if (error == 0) {
      error = src_process(state,&src_data);
      if (error == 0) {
        if (src_data.input_frames_used == 0x2000) {
          memcpy(varispeed_test::input,varispeed_test::output,0x10000);
          reverse_data(varispeed_test::input,(uint)src_data.output_frames_gen);
          error = src_reset(state);
          uVar1 = (uint)src_data.output_frames_gen;
          if (error == 0) {
            src_data.end_of_input = 1;
            src_data.data_in = varispeed_test::input;
            src_data.input_frames =
                 CONCAT44(src_data.output_frames_gen._4_4_,(uint)src_data.output_frames_gen);
            src_data.data_out = varispeed_test::output;
            src_data.output_frames = 0x4000;
            error = src_set_ratio(state,1.0 / src_data.src_ratio);
            if (error == 0) {
              error = src_process(state,&src_data);
              if (error != 0) {
                pcVar4 = src_strerror(error);
                uVar3 = 0x9a;
                goto LAB_0010165f;
              }
              if (src_data.input_frames_used == (int)uVar1) {
                src_delete(state);
                dVar5 = calculate_snr(varispeed_test::output,(uint)src_data.output_frames_gen,1);
                if (target_snr <= dVar5) {
                  return;
                }
                printf("\n\nLine %d : snr (%3.1f) does not meet target (%3.1f)\n\n",0xac);
                save_oct_float("varispeed.mat",varispeed_test::input,(int)src_data.input_frames,
                               varispeed_test::output,(uint)src_data.output_frames_gen);
                goto LAB_001016c1;
              }
              printf("\n\nLine %d : unused input.\n",0xa1);
              uVar2 = (ulong)uVar1;
              goto LAB_001016a7;
            }
            pcVar4 = src_strerror(error);
            __format = "\n\nLine %d : %s\n\n";
            uStack_80 = 0x95;
          }
          else {
            pcVar4 = src_strerror(error);
            __format = "\n\nLine %d : %s\n\n";
            uStack_80 = 0x88;
          }
          goto LAB_00101640;
        }
        printf("\n\nLine %d : unused input.\n",0x7d);
        uVar2 = 0x2000;
LAB_001016a7:
        printf("\tinput_len         : %d\n",uVar2);
        pcVar4 = "\tinput_frames_used : %ld\n\n";
      }
      else {
        pcVar4 = src_strerror(error);
        uVar3 = 0x76;
LAB_0010165f:
        printf("\n\nLine %d : %s\n\n",uVar3,pcVar4);
        printf("  src_data.input_frames  : %ld\n",src_data.input_frames);
        pcVar4 = "  src_data.output_frames : %ld\n\n";
        src_data.input_frames_used = src_data.output_frames;
      }
      printf(pcVar4,src_data.input_frames_used);
      goto LAB_001016c1;
    }
    pcVar4 = src_strerror(error);
    __format = "\n\nLine %d : %s\n\n";
    uStack_80 = 0x71;
  }
LAB_00101640:
  printf(__format,uStack_80,pcVar4);
LAB_001016c1:
  exit(1);
}

Assistant:

static void
varispeed_test (int converter, double target_snr)
{	static float input [BUFFER_LEN], output [BUFFER_LEN] ;
	double sine_freq, snr ;

	SRC_STATE	*src_state ;
	SRC_DATA	src_data ;

	int input_len, error ;

	memset (input, 0, sizeof (input)) ;

	input_len = ARRAY_LEN (input) / 2 ;

	sine_freq = 0.0111 ;
	gen_windowed_sines (1, &sine_freq, 1.0, input, input_len) ;

	/* Perform sample rate conversion. */
	if ((src_state = src_new (converter, 1, &error)) == NULL)
	{	printf ("\n\nLine %d : src_new () failed : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	src_data.end_of_input = 1 ;

	src_data.data_in = input ;
	src_data.input_frames = input_len ;

	src_data.src_ratio = 3.0 ;

	src_data.data_out = output ;
	src_data.output_frames = ARRAY_LEN (output) ;

	if ((error = src_set_ratio (src_state, 1.0 / src_data.src_ratio)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	if ((error = src_process (src_state, &src_data)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		printf ("  src_data.input_frames  : %ld\n", src_data.input_frames) ;
		printf ("  src_data.output_frames : %ld\n\n", src_data.output_frames) ;
		exit (1) ;
		} ;

	if (src_data.input_frames_used != input_len)
	{	printf ("\n\nLine %d : unused input.\n", __LINE__) ;
		printf ("\tinput_len         : %d\n", input_len) ;
		printf ("\tinput_frames_used : %ld\n\n", src_data.input_frames_used) ;
		exit (1) ;
		} ;

	/* Copy the last output to the input. */
	memcpy (input, output, sizeof (input)) ;
	reverse_data (input, src_data.output_frames_gen) ;

	if ((error = src_reset (src_state)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	src_data.end_of_input = 1 ;

	src_data.data_in = input ;
	input_len = src_data.input_frames = src_data.output_frames_gen ;

	src_data.data_out = output ;
	src_data.output_frames = ARRAY_LEN (output) ;

	if ((error = src_set_ratio (src_state, 1.0 / src_data.src_ratio)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	if ((error = src_process (src_state, &src_data)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		printf ("  src_data.input_frames  : %ld\n", src_data.input_frames) ;
		printf ("  src_data.output_frames : %ld\n\n", src_data.output_frames) ;
		exit (1) ;
		} ;

	if (src_data.input_frames_used != input_len)
	{	printf ("\n\nLine %d : unused input.\n", __LINE__) ;
		printf ("\tinput_len         : %d\n", input_len) ;
		printf ("\tinput_frames_used : %ld\n\n", src_data.input_frames_used) ;
		exit (1) ;
		} ;

	src_state = src_delete (src_state) ;

	snr = calculate_snr (output, src_data.output_frames_gen, 1) ;

	if (target_snr > snr)
	{	printf ("\n\nLine %d : snr (%3.1f) does not meet target (%3.1f)\n\n", __LINE__, snr, target_snr) ;
		save_oct_float ("varispeed.mat", input, src_data.input_frames, output, src_data.output_frames_gen) ;
		exit (1) ;
		} ;

	return ;
}